

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int ly_set_add(ly_set *set,void *node,int options)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  lys_node **__ptr;
  LY_ERR *pLVar4;
  ulong uVar5;
  
  if (set == (ly_set *)0x0 || node == (void *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
LAB_00157e60:
    iVar2 = -1;
  }
  else {
    uVar1 = set->number;
    uVar3 = (ulong)uVar1;
    if ((options & 1U) == 0) {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        if ((set->set).s[uVar5] == (lys_node *)node) {
          return (int)uVar5;
        }
      }
    }
    __ptr = (set->set).s;
    if (set->size == uVar1) {
      __ptr = (lys_node **)realloc(__ptr,(ulong)(uVar1 + 8) << 3);
      if (__ptr == (lys_node **)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","ly_set_add");
        goto LAB_00157e60;
      }
      set->size = set->size + 8;
      (set->set).s = __ptr;
      uVar3 = (ulong)set->number;
    }
    iVar2 = (int)uVar3;
    set->number = iVar2 + 1;
    __ptr[uVar3] = (lys_node *)node;
  }
  return iVar2;
}

Assistant:

API int
ly_set_add(struct ly_set *set, void *node, int options)
{
    unsigned int i;
    void **new;

    if (!set || !node) {
        ly_errno = LY_EINVAL;
        return -1;
    }

    if (!(options & LY_SET_OPT_USEASLIST)) {
        /* search for duplication */
        for (i = 0; i < set->number; i++) {
            if (set->set.g[i] == node) {
                /* already in set */
                return i;
            }
        }
    }

    if (set->size == set->number) {
        new = realloc(set->set.g, (set->size + 8) * sizeof *(set->set.g));
        if (!new) {
            LOGMEM;
            return -1;
        }
        set->size += 8;
        set->set.g = new;
    }

    set->set.g[set->number++] = node;

    return set->number - 1;
}